

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void VP8LBundleColorMap_C(uint8_t *row,int width,int xbits,uint32_t *dst)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (xbits < 1) {
    uVar5 = 0;
    uVar3 = (ulong)(uint)width;
    if (width < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      dst[uVar5] = (uint)row[uVar5] << 8 | 0xff000000;
    }
  }
  else {
    bVar1 = (byte)xbits;
    uVar5 = 0;
    uVar3 = (ulong)(uint)width;
    if (width < 1) {
      uVar3 = uVar5;
    }
    uVar2 = 0xff000000;
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = (uint)uVar5 & ~(-1 << (bVar1 & 0x1f));
      if (uVar4 == 0) {
        uVar2 = 0xff000000;
      }
      uVar2 = uVar2 | (uint)row[uVar5] << ((char)(uVar4 << (3 - bVar1 & 0x1f)) + 8U & 0x1f);
      dst[(uint)uVar5 >> (bVar1 & 0x1f)] = uVar2;
    }
  }
  return;
}

Assistant:

void VP8LBundleColorMap_C(const uint8_t* const row, int width, int xbits,
                          uint32_t* dst) {
  int x;
  if (xbits > 0) {
    const int bit_depth = 1 << (3 - xbits);
    const int mask = (1 << xbits) - 1;
    uint32_t code = 0xff000000;
    for (x = 0; x < width; ++x) {
      const int xsub = x & mask;
      if (xsub == 0) {
        code = 0xff000000;
      }
      code |= row[x] << (8 + bit_depth * xsub);
      dst[x >> xbits] = code;
    }
  } else {
    for (x = 0; x < width; ++x) dst[x] = 0xff000000 | (row[x] << 8);
  }
}